

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_encoder.c
# Opt level: O0

int pt_enc_next(pt_encoder *encoder,pt_packet *packet)

{
  uint8_t plc_00;
  pt_ip_compression pVar1;
  ulong uVar2;
  int iVar3;
  byte bVar4;
  int size_00;
  ulong uVar5;
  uint8_t *puVar6;
  byte local_a9;
  byte local_a2;
  uint8_t type;
  int size;
  uint8_t ext_1;
  uint8_t plc;
  uint64_t payload_1;
  uint64_t payload;
  ulong uStack_88;
  uint8_t ext;
  uint64_t ctc_1;
  uint8_t end;
  uint8_t index;
  uint8_t byte [15];
  uint16_t fc;
  uint16_t ctc;
  uint64_t cr3;
  uint8_t mode;
  uint64_t stop_1;
  uint64_t tnt;
  uint8_t stop;
  uint8_t opc;
  uint64_t psb;
  int errcode;
  uint8_t *begin;
  uint8_t *pos;
  pt_packet *packet_local;
  pt_encoder *encoder_local;
  
  if ((encoder == (pt_encoder *)0x0) || (packet == (pt_packet *)0x0)) {
    encoder_local._4_4_ = -2;
  }
  else {
    begin = encoder->pos;
    iVar3 = (int)begin;
    switch(packet->type) {
    case ppt_invalid:
    case ppt_unknown:
      encoder_local._4_4_ = -4;
      break;
    case ppt_pad:
      encoder_local._4_4_ = pt_reserve(encoder,1);
      if (-1 < encoder_local._4_4_) {
        *begin = 0;
        encoder->pos = begin + 1;
        encoder_local._4_4_ = (int)(begin + 1) - iVar3;
      }
      break;
    case ppt_psb:
      encoder_local._4_4_ = pt_reserve(encoder,0x10);
      if (-1 < encoder_local._4_4_) {
        puVar6 = pt_encode_int(begin,0x8202820282028202,8);
        puVar6 = pt_encode_int(puVar6,0x8202820282028202,8);
        encoder->pos = puVar6;
        encoder_local._4_4_ = (int)puVar6 - iVar3;
      }
      break;
    case ppt_psbend:
      encoder_local._4_4_ = pt_reserve(encoder,2);
      if (-1 < encoder_local._4_4_) {
        *begin = 2;
        begin[1] = 0x23;
        encoder->pos = begin + 2;
        encoder_local._4_4_ = (int)(begin + 2) - iVar3;
      }
      break;
    case ppt_fup:
      encoder_local._4_4_ = pt_encode_ip(encoder,pt_opc_fup,&(packet->payload).ip);
      break;
    case ppt_tip:
      encoder_local._4_4_ = pt_encode_ip(encoder,pt_opc_tip,&(packet->payload).ip);
      break;
    case ppt_tip_pge:
      encoder_local._4_4_ = pt_encode_ip(encoder,pt_opc_tip_pge,&(packet->payload).ip);
      break;
    case ppt_tip_pgd:
      encoder_local._4_4_ = pt_encode_ip(encoder,pt_opc_tip_pgd,&(packet->payload).ip);
      break;
    case ppt_tnt_8:
      if ((packet->payload).tnt.bit_size < 7) {
        encoder_local._4_4_ = pt_reserve(encoder,1);
        if (-1 < encoder_local._4_4_) {
          *begin = (byte)((packet->payload).tnt.payload << 1) |
                   (byte)(1 << ((packet->payload).tnt.bit_size + 1 & 0x1f));
          encoder->pos = begin + 1;
          encoder_local._4_4_ = (int)(begin + 1) - iVar3;
        }
      }
      else {
        encoder_local._4_4_ = -5;
      }
      break;
    case ppt_tnt_64:
      encoder_local._4_4_ = pt_reserve(encoder,8);
      if (-1 < encoder_local._4_4_) {
        if ((packet->payload).tnt.bit_size < 0x30) {
          uVar5 = 1L << ((packet->payload).tnt.bit_size & 0x3f);
          uVar2 = (packet->payload).tnt.payload;
          if ((uVar2 & (uVar5 - 1 ^ 0xffffffffffffffff)) == 0) {
            *begin = 2;
            begin[1] = 0xa3;
            puVar6 = pt_encode_int(begin + 2,uVar2 | uVar5,6);
            encoder->pos = puVar6;
            encoder_local._4_4_ = (int)puVar6 - iVar3;
          }
          else {
            encoder_local._4_4_ = -2;
          }
        }
        else {
          encoder_local._4_4_ = -2;
        }
      }
      break;
    case ppt_mode:
      encoder_local._4_4_ = pt_reserve(encoder,2);
      if (-1 < encoder_local._4_4_) {
        pVar1 = (packet->payload).ip.ipc;
        if (pVar1 == pt_ipc_suppressed) {
          cr3._7_1_ = ((packet->payload).cfe.vector & 1) != 0;
          if (((packet->payload).cfe.vector >> 1 & 1) != 0) {
            cr3._7_1_ = cr3._7_1_ | 2;
          }
          if (((packet->payload).cfe.vector >> 2 & 1) != 0) {
            cr3._7_1_ = cr3._7_1_ | 4;
          }
        }
        else {
          if (pVar1 != 0x20) {
            return -5;
          }
          cr3._7_1_ = 0x20;
          if (((packet->payload).cfe.vector & 1) != 0) {
            cr3._7_1_ = 0x21;
          }
          if (((packet->payload).cfe.vector >> 1 & 1) != 0) {
            cr3._7_1_ = cr3._7_1_ | 2;
          }
        }
        *begin = 0x99;
        begin[1] = cr3._7_1_;
        encoder->pos = begin + 2;
        encoder_local._4_4_ = (int)(begin + 2) - iVar3;
      }
      break;
    case ppt_pip:
      encoder_local._4_4_ = pt_reserve(encoder,8);
      if (-1 < encoder_local._4_4_) {
        register0x00000000 = ((packet->payload).pip.cr3 >> 5) << 1;
        if (((packet->payload).ptw.plc & 1) != 0) {
          register0x00000000 = register0x00000000 | 1;
        }
        *begin = 2;
        begin[1] = 0x43;
        puVar6 = pt_encode_int(begin + 2,stack0xffffffffffffff98,6);
        encoder->pos = puVar6;
        encoder_local._4_4_ = (int)puVar6 - iVar3;
      }
      break;
    case ppt_vmcs:
      encoder_local._4_4_ = pt_reserve(encoder,7);
      if (-1 < encoder_local._4_4_) {
        *begin = 2;
        begin[1] = 200;
        puVar6 = pt_encode_int(begin + 2,(packet->payload).pip.cr3 >> 0xc,5);
        encoder->pos = puVar6;
        encoder_local._4_4_ = (int)puVar6 - iVar3;
      }
      break;
    case ppt_cbr:
      encoder_local._4_4_ = pt_reserve(encoder,4);
      if (-1 < encoder_local._4_4_) {
        *begin = 2;
        begin[1] = 3;
        begin[2] = (packet->payload).tnt.bit_size;
        begin[3] = 0;
        encoder->pos = begin + 4;
        encoder_local._4_4_ = (int)(begin + 4) - iVar3;
      }
      break;
    case ppt_tsc:
      encoder_local._4_4_ = pt_reserve(encoder,8);
      if (-1 < encoder_local._4_4_) {
        *begin = 0x19;
        puVar6 = pt_encode_int(begin + 1,(packet->payload).pip.cr3,7);
        encoder->pos = puVar6;
        encoder_local._4_4_ = (int)puVar6 - iVar3;
      }
      break;
    case ppt_tma:
      encoder_local._4_4_ = pt_reserve(encoder,7);
      if (-1 < encoder_local._4_4_) {
        byte._9_2_ = (packet->payload).tma.ctc;
        byte._7_2_ = (packet->payload).tma.fc;
        if ((byte._7_2_ & 0xfe00) == 0) {
          *begin = 2;
          begin[1] = 0x73;
          puVar6 = pt_encode_int(begin + 2,(ulong)(ushort)byte._9_2_,2);
          *puVar6 = '\0';
          puVar6 = pt_encode_int(puVar6 + 1,(ulong)(ushort)byte._7_2_,2);
          encoder->pos = puVar6;
          encoder_local._4_4_ = (int)puVar6 - iVar3;
        }
        else {
          encoder_local._4_4_ = -5;
        }
      }
      break;
    case ppt_mtc:
      encoder_local._4_4_ = pt_reserve(encoder,2);
      if (-1 < encoder_local._4_4_) {
        *begin = 0x59;
        begin[1] = (packet->payload).tnt.bit_size;
        encoder->pos = begin + 2;
        encoder_local._4_4_ = (int)(begin + 2) - iVar3;
      }
      break;
    case ppt_cyc:
      bVar4 = (byte)(((packet->payload).pip.cr3 & 0xff) << 3);
      ctc_1._5_1_ = bVar4 | 3;
      uStack_88 = (packet->payload).pip.cr3 >> 5;
      if (uStack_88 != 0) {
        ctc_1._5_1_ = bVar4 | 7;
      }
      ctc_1._3_1_ = 1;
      while (uStack_88 != 0) {
        if (0xe < ctc_1._3_1_) {
          return -5;
        }
        *(char *)((long)&ctc_1 + (ulong)ctc_1._3_1_ + 5) = (char)(uStack_88 << 1);
        uStack_88 = (uStack_88 << 1) >> 8;
        if (uStack_88 != 0) {
          *(byte *)((long)&ctc_1 + (ulong)ctc_1._3_1_ + 5) =
               *(byte *)((long)&ctc_1 + (ulong)ctc_1._3_1_ + 5) | 1;
        }
        ctc_1._3_1_ = ctc_1._3_1_ + 1;
      }
      encoder_local._4_4_ = pt_reserve(encoder,(uint)ctc_1._3_1_);
      if (-1 < encoder_local._4_4_) {
        for (ctc_1._4_1_ = 0; ctc_1._4_1_ < ctc_1._3_1_; ctc_1._4_1_ = ctc_1._4_1_ + 1) {
          *begin = *(uint8_t *)((long)&ctc_1 + (ulong)ctc_1._4_1_ + 5);
          begin = begin + 1;
        }
        encoder->pos = begin;
        encoder_local._4_4_ = (int)begin - iVar3;
      }
      break;
    case ppt_stop:
      encoder_local._4_4_ = pt_reserve(encoder,2);
      if (-1 < encoder_local._4_4_) {
        *begin = 2;
        begin[1] = 0x83;
        encoder->pos = begin + 2;
        encoder_local._4_4_ = (int)(begin + 2) - iVar3;
      }
      break;
    case ppt_ovf:
      encoder_local._4_4_ = pt_reserve(encoder,2);
      if (-1 < encoder_local._4_4_) {
        *begin = 2;
        begin[1] = 0xf3;
        encoder->pos = begin + 2;
        encoder_local._4_4_ = (int)(begin + 2) - iVar3;
      }
      break;
    case ppt_mnt:
      encoder_local._4_4_ = pt_reserve(encoder,0xb);
      if (-1 < encoder_local._4_4_) {
        *begin = 2;
        begin[1] = 0xc3;
        begin[2] = 0x88;
        puVar6 = pt_encode_int(begin + 3,(packet->payload).pip.cr3,8);
        encoder->pos = puVar6;
        encoder_local._4_4_ = (int)puVar6 - iVar3;
      }
      break;
    case ppt_exstop:
      encoder_local._4_4_ = pt_reserve(encoder,2);
      if (-1 < encoder_local._4_4_) {
        bVar4 = 0x62;
        if (((packet->payload).tnt.bit_size & 1) != 0) {
          bVar4 = 0xe2;
        }
        *begin = 2;
        begin[1] = bVar4;
        encoder->pos = begin + 2;
        encoder_local._4_4_ = (int)(begin + 2) - iVar3;
      }
      break;
    case ppt_mwait:
      encoder_local._4_4_ = pt_reserve(encoder,10);
      if (-1 < encoder_local._4_4_) {
        *begin = 2;
        begin[1] = 0xc2;
        puVar6 = pt_encode_int(begin + 2,(ulong)(packet->payload).ip.ipc,4);
        puVar6 = pt_encode_int(puVar6,(ulong)(packet->payload).mwait.ext,4);
        encoder->pos = puVar6;
        encoder_local._4_4_ = (int)puVar6 - iVar3;
      }
      break;
    case ppt_pwre:
      encoder_local._4_4_ = pt_reserve(encoder,4);
      if (-1 < encoder_local._4_4_) {
        payload_1 = ((ulong)(packet->payload).pwre.sub_state & 0xf) << 8 |
                    ((ulong)(packet->payload).tnt.bit_size & 0xf) << 0xc;
        if ((undefined1  [16])((undefined1  [16])packet->payload & (undefined1  [16])0x10000) !=
            (undefined1  [16])0x0) {
          payload_1 = payload_1 | 8;
        }
        *begin = 2;
        begin[1] = 0x22;
        puVar6 = pt_encode_int(begin + 2,payload_1,2);
        encoder->pos = puVar6;
        encoder_local._4_4_ = (int)puVar6 - iVar3;
      }
      break;
    case ppt_pwrx:
      encoder_local._4_4_ = pt_reserve(encoder,7);
      if (-1 < encoder_local._4_4_) {
        _size = (ulong)(packet->payload).pwre.sub_state & 0xf |
                ((ulong)(packet->payload).tnt.bit_size & 0xf) << 4;
        if ((undefined1  [16])((undefined1  [16])packet->payload & (undefined1  [16])0x10000) !=
            (undefined1  [16])0x0) {
          _size = _size | 0x100;
        }
        if ((*(byte *)((long)&packet->payload + 2) >> 1 & 1) != 0) {
          _size = _size | 0x400;
        }
        if ((*(byte *)((long)&packet->payload + 2) >> 2 & 1) != 0) {
          _size = _size | 0x800;
        }
        *begin = 2;
        begin[1] = 0xa2;
        puVar6 = pt_encode_int(begin + 2,_size,5);
        encoder->pos = puVar6;
        encoder_local._4_4_ = (int)puVar6 - iVar3;
      }
      break;
    case ppt_ptw:
      plc_00 = (packet->payload).ptw.plc;
      size_00 = pt_ptw_size(plc_00);
      encoder_local._4_4_ = size_00;
      if ((-1 < size_00) &&
         (encoder_local._4_4_ = pt_reserve(encoder,size_00 + 2), -1 < encoder_local._4_4_)) {
        bVar4 = plc_00 << 5;
        local_a2 = bVar4 | 0x12;
        if ((undefined1  [16])((undefined1  [16])packet->payload & (undefined1  [16])0x100) !=
            (undefined1  [16])0x0) {
          local_a2 = bVar4 | 0x92;
        }
        *begin = 2;
        begin[1] = local_a2;
        puVar6 = pt_encode_int(begin + 2,(packet->payload).pip.cr3,size_00);
        encoder->pos = puVar6;
        encoder_local._4_4_ = (int)puVar6 - iVar3;
      }
      break;
    case ppt_cfe:
      encoder_local._4_4_ = pt_reserve(encoder,4);
      if (-1 < encoder_local._4_4_) {
        *begin = 2;
        begin[1] = 0x13;
        local_a9 = (packet->payload).pwre.state & 0x1f;
        if ((undefined1  [16])((undefined1  [16])packet->payload & (undefined1  [16])0x10000000000)
            != (undefined1  [16])0x0) {
          local_a9 = local_a9 | 0x80;
        }
        begin[2] = local_a9;
        begin[3] = (packet->payload).cfe.vector;
        encoder->pos = begin + 4;
        encoder_local._4_4_ = (int)(begin + 4) - iVar3;
      }
      break;
    case ppt_evd:
      encoder_local._4_4_ = pt_reserve(encoder,0xb);
      if (-1 < encoder_local._4_4_) {
        *begin = 2;
        begin[1] = 0x53;
        begin[2] = (packet->payload).pwre.state & 0x1f;
        puVar6 = pt_encode_int(begin + 3,(packet->payload).tnt.payload,8);
        encoder->pos = puVar6;
        encoder_local._4_4_ = (int)puVar6 - iVar3;
      }
      break;
    default:
      encoder_local._4_4_ = -4;
    }
  }
  return encoder_local._4_4_;
}

Assistant:

int pt_enc_next(struct pt_encoder *encoder, const struct pt_packet *packet)
{
	uint8_t *pos, *begin;
	int errcode;

	if (!encoder || !packet)
		return -pte_invalid;

	pos = begin = encoder->pos;
	switch (packet->type) {
	case ppt_pad:
		errcode = pt_reserve(encoder, ptps_pad);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_pad;

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_psb: {
		uint64_t psb;

		errcode = pt_reserve(encoder, ptps_psb);
		if (errcode < 0)
			return errcode;

		psb = ((uint64_t) pt_psb_hilo << 48 |
		       (uint64_t) pt_psb_hilo << 32 |
		       (uint64_t) pt_psb_hilo << 16 |
		       (uint64_t) pt_psb_hilo);

		pos = pt_encode_int(pos, psb, 8);
		pos = pt_encode_int(pos, psb, 8);

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_psbend:
		errcode = pt_reserve(encoder, ptps_psbend);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_psbend;

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_ovf:
		errcode = pt_reserve(encoder, ptps_ovf);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_ovf;

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_fup:
		return pt_encode_ip(encoder, pt_opc_fup, &packet->payload.ip);

	case ppt_tip:
		return pt_encode_ip(encoder, pt_opc_tip, &packet->payload.ip);

	case ppt_tip_pge:
		return pt_encode_ip(encoder, pt_opc_tip_pge,
				    &packet->payload.ip);

	case ppt_tip_pgd:
		return pt_encode_ip(encoder, pt_opc_tip_pgd,
				    &packet->payload.ip);

	case ppt_tnt_8: {
		uint8_t opc, stop;

		if (packet->payload.tnt.bit_size >= 7)
			return -pte_bad_packet;

		errcode = pt_reserve(encoder, ptps_tnt_8);
		if (errcode < 0)
			return errcode;

		stop = packet->payload.tnt.bit_size + pt_opm_tnt_8_shr;
		opc = (uint8_t)
			(packet->payload.tnt.payload << pt_opm_tnt_8_shr);

		*pos++ = (uint8_t) (opc | (1u << stop));

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_tnt_64: {
		uint64_t tnt, stop;

		errcode = pt_reserve(encoder, ptps_tnt_64);
		if (errcode < 0)
			return errcode;

		if (packet->payload.tnt.bit_size >= pt_pl_tnt_64_bits)
			return -pte_invalid;

		stop = 1ull << packet->payload.tnt.bit_size;
		tnt = packet->payload.tnt.payload;

		if (tnt & ~(stop - 1))
			return -pte_invalid;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_tnt_64;
		pos = pt_encode_int(pos, tnt | stop, pt_pl_tnt_64_size);

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_mode: {
		uint8_t mode;

		errcode = pt_reserve(encoder, ptps_mode);
		if (errcode < 0)
			return errcode;

		switch (packet->payload.mode.leaf) {
		default:
			return -pte_bad_packet;

		case pt_mol_exec:
			mode = pt_mol_exec;

			if (packet->payload.mode.bits.exec.csl)
				mode |= pt_mob_exec_csl;

			if (packet->payload.mode.bits.exec.csd)
				mode |= pt_mob_exec_csd;

			if (packet->payload.mode.bits.exec.iflag)
				mode |= pt_mob_exec_iflag;
			break;

		case pt_mol_tsx:
			mode = pt_mol_tsx;

			if (packet->payload.mode.bits.tsx.intx)
				mode |= pt_mob_tsx_intx;

			if (packet->payload.mode.bits.tsx.abrt)
				mode |= pt_mob_tsx_abrt;
			break;
		}

		*pos++ = pt_opc_mode;
		*pos++ = mode;

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_pip: {
		uint64_t cr3;

		errcode = pt_reserve(encoder, ptps_pip);
		if (errcode < 0)
			return errcode;

		cr3 = packet->payload.pip.cr3;
		cr3 >>= pt_pl_pip_shl;
		cr3 <<= pt_pl_pip_shr;

		if (packet->payload.pip.nr)
			cr3 |= (uint64_t) pt_pl_pip_nr;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_pip;
		pos = pt_encode_int(pos, cr3, pt_pl_pip_size);

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_tsc:
		errcode = pt_reserve(encoder, ptps_tsc);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_tsc;
		pos = pt_encode_int(pos, packet->payload.tsc.tsc,
				    pt_pl_tsc_size);

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_cbr:
		errcode = pt_reserve(encoder, ptps_cbr);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_cbr;
		*pos++ = packet->payload.cbr.ratio;
		*pos++ = 0;

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_tma: {
		uint16_t ctc, fc;

		errcode = pt_reserve(encoder, ptps_tma);
		if (errcode < 0)
			return errcode;

		ctc = packet->payload.tma.ctc;
		fc = packet->payload.tma.fc;

		if (fc & ~pt_pl_tma_fc_mask)
			return -pte_bad_packet;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_tma;
		pos = pt_encode_int(pos, ctc, pt_pl_tma_ctc_size);
		*pos++ = 0;
		pos = pt_encode_int(pos, fc, pt_pl_tma_fc_size);

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_mtc:
		errcode = pt_reserve(encoder, ptps_mtc);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_mtc;
		*pos++ = packet->payload.mtc.ctc;

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_cyc: {
		uint8_t byte[pt_pl_cyc_max_size], index, end;
		uint64_t ctc;

		ctc = (uint8_t) packet->payload.cyc.value;
		ctc <<= pt_opm_cyc_shr;

		byte[0] = pt_opc_cyc;
		byte[0] |= (uint8_t) ctc;

		ctc = packet->payload.cyc.value;
		ctc >>= (8 - pt_opm_cyc_shr);
		if (ctc)
			byte[0] |= pt_opm_cyc_ext;

		for (end = 1; ctc; ++end) {
			/* Check if the CYC payload is too big. */
			if (pt_pl_cyc_max_size <= end)
				return -pte_bad_packet;

			ctc <<= pt_opm_cycx_shr;

			byte[end] = (uint8_t) ctc;

			ctc >>= 8;
			if (ctc)
				byte[end] |= pt_opm_cycx_ext;
		}

		errcode = pt_reserve(encoder, end);
		if (errcode < 0)
			return errcode;

		for (index = 0; index < end; ++index)
			*pos++ = byte[index];

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_stop:
		errcode = pt_reserve(encoder, ptps_stop);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_stop;

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_vmcs:
		errcode = pt_reserve(encoder, ptps_vmcs);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_vmcs;
		pos = pt_encode_int(pos,
				    packet->payload.vmcs.base >> pt_pl_vmcs_shl,
				    pt_pl_vmcs_size);

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_mnt:
		errcode = pt_reserve(encoder, ptps_mnt);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_ext2;
		*pos++ = pt_ext2_mnt;
		pos = pt_encode_int(pos, packet->payload.mnt.payload,
				    pt_pl_mnt_size);

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_exstop: {
		uint8_t ext;

		errcode = pt_reserve(encoder, ptps_exstop);
		if (errcode < 0)
			return errcode;

		ext = packet->payload.exstop.ip ?
			pt_ext_exstop_ip : pt_ext_exstop;

		*pos++ = pt_opc_ext;
		*pos++ = ext;

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_mwait:
		errcode = pt_reserve(encoder, ptps_mwait);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_mwait;
		pos = pt_encode_int(pos, packet->payload.mwait.hints,
				    pt_pl_mwait_hints_size);
		pos = pt_encode_int(pos, packet->payload.mwait.ext,
				    pt_pl_mwait_ext_size);

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_pwre: {
		uint64_t payload;

		errcode = pt_reserve(encoder, ptps_pwre);
		if (errcode < 0)
			return errcode;

		payload = 0ull;
		payload |= ((uint64_t) packet->payload.pwre.state <<
			    pt_pl_pwre_state_shr) &
			(uint64_t) pt_pl_pwre_state_mask;
		payload |= ((uint64_t) packet->payload.pwre.sub_state <<
			    pt_pl_pwre_sub_state_shr) &
			(uint64_t) pt_pl_pwre_sub_state_mask;

		if (packet->payload.pwre.hw)
			payload |= (uint64_t) pt_pl_pwre_hw_mask;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_pwre;
		pos = pt_encode_int(pos, payload, pt_pl_pwre_size);

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_pwrx: {
		uint64_t payload;

		errcode = pt_reserve(encoder, ptps_pwrx);
		if (errcode < 0)
			return errcode;

		payload = 0ull;
		payload |= ((uint64_t) packet->payload.pwrx.last <<
			    pt_pl_pwrx_last_shr) &
			(uint64_t) pt_pl_pwrx_last_mask;
		payload |= ((uint64_t) packet->payload.pwrx.deepest <<
			    pt_pl_pwrx_deepest_shr) &
			(uint64_t) pt_pl_pwrx_deepest_mask;

		if (packet->payload.pwrx.interrupt)
			payload |= (uint64_t) pt_pl_pwrx_wr_int;
		if (packet->payload.pwrx.store)
			payload |= (uint64_t) pt_pl_pwrx_wr_store;
		if (packet->payload.pwrx.autonomous)
			payload |= (uint64_t) pt_pl_pwrx_wr_hw;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_pwrx;
		pos = pt_encode_int(pos, payload, pt_pl_pwrx_size);

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_ptw: {
		uint8_t plc, ext;
		int size;

		plc = packet->payload.ptw.plc;

		size = pt_ptw_size(plc);
		if (size < 0)
			return size;

		errcode = pt_reserve(encoder,
				     (unsigned int) (pt_opcs_ptw + size));
		if (errcode < 0)
			return errcode;

		ext = pt_ext_ptw;
		ext |= plc << pt_opm_ptw_pb_shr;

		if (packet->payload.ptw.ip)
			ext |= (uint8_t) pt_opm_ptw_ip;

		*pos++ = pt_opc_ext;
		*pos++ = ext;
		pos = pt_encode_int(pos, packet->payload.ptw.payload, size);

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_cfe: {
		uint8_t type;

		errcode = pt_reserve(encoder, ptps_cfe);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_cfe;

		type = packet->payload.cfe.type & pt_pl_cfe_type;
		if (packet->payload.cfe.ip)
			type |= pt_pl_cfe_ip;

		*pos++ = type;
		*pos++ = packet->payload.cfe.vector;

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_evd:
		errcode = pt_reserve(encoder, ptps_evd);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_evd;

		*pos++ = packet->payload.evd.type & pt_pl_evd_type;
		pos = pt_encode_int(pos, packet->payload.evd.payload,
				    pt_pl_evd_pl_size);

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_unknown:
	case ppt_invalid:
		return -pte_bad_opc;
	}

	return -pte_bad_opc;
}